

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O2

int __thiscall Fl_Preferences::Node::remove(Node *this,char *__filename)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  Node *pNVar4;
  int iVar5;
  undefined8 unaff_RBP;
  
  pNVar3 = (this->field_2).parent_;
  if (pNVar3 == (Node *)0x0 || (this->field_0x30 & 2) != 0) {
    iVar5 = 0;
  }
  else {
    pNVar4 = (Node *)0x0;
    pNVar2 = pNVar3;
    while (pNVar1 = pNVar2->child_, pNVar1 != (Node *)0x0) {
      if (pNVar1 == this) {
        pNVar2 = (Node *)&pNVar4->next_;
        if (pNVar4 == (Node *)0x0) {
          pNVar2 = pNVar3;
        }
        pNVar2->child_ = pNVar1->next_;
        break;
      }
      pNVar4 = pNVar1;
      pNVar2 = (Node *)&pNVar1->next_;
    }
    iVar5 = (int)CONCAT71((int7)((ulong)unaff_RBP >> 8),pNVar1 != (Node *)0x0);
    pNVar2 = (Node *)0x0;
    pNVar3 = (Node *)0x0;
    if ((this->field_0x30 & 2) == 0) {
      pNVar3 = (this->field_2).parent_;
    }
    pNVar3->field_0x30 = pNVar3->field_0x30 | 1;
    if ((this->field_0x30 & 2) == 0) {
      pNVar2 = (this->field_2).parent_;
    }
    pNVar2->field_0x30 = pNVar2->field_0x30 & 0xfb;
  }
  ~Node(this);
  operator_delete(this,0x48);
  return iVar5;
}

Assistant:

char Fl_Preferences::Node::remove() {
  Node *nd = 0, *np;
  if ( parent() ) {
    nd = parent()->child_; np = 0L;
    for ( ; nd; np = nd, nd = nd->next_ ) {
      if ( nd == this ) {
	if ( np )
	  np->next_ = nd->next_;
	else
	  parent()->child_ = nd->next_;
	break;
      }
    }
    parent()->dirty_ = 1;
    parent()->updateIndex();
  }
  delete this;
  return ( nd != 0 );
}